

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall anon_unknown.dwarf_515ef::Loop0Expr::parse_term(Loop0Expr *this,Context *con)

{
  element_type *peVar1;
  int iVar2;
  ParsingState *st_00;
  ParsingState s;
  ParsingState st;
  ParsingState local_68;
  ParsingState local_48;
  
  st_00 = &local_68;
  local_48.position.line = (con->position).line;
  local_48.position.col = (con->position).col;
  local_48.position.it.buffer._0_4_ = *(undefined4 *)&(con->position).it.buffer;
  local_48.position.it.buffer._4_4_ = *(undefined4 *)((long)&(con->position).it.buffer + 4);
  local_48.position.it.idx._0_4_ = (undefined4)(con->position).it.idx;
  local_48.position.it.idx._4_4_ = *(undefined4 *)((long)&(con->position).it.idx + 4);
  local_48.matches =
       ((long)(con->matches).
              super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(con->matches).
              super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  iVar2 = (*((this->super_UnaryExpr).expr.super_shared_ptr<pegmatite::Expr>.
             super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Expr[3])
                    ();
  if ((char)iVar2 == '\0') {
    st_00 = &local_48;
  }
  else {
    do {
      local_68.position.line = (con->position).line;
      local_68.position.col = (con->position).col;
      local_68.position.it.buffer._0_4_ = *(undefined4 *)&(con->position).it.buffer;
      local_68.position.it.buffer._4_4_ = *(undefined4 *)((long)&(con->position).it.buffer + 4);
      local_68.position.it.idx._0_4_ = (undefined4)(con->position).it.idx;
      local_68.position.it.idx._4_4_ = *(undefined4 *)((long)&(con->position).it.idx + 4);
      local_68.matches =
           ((long)(con->matches).
                  super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(con->matches).
                  super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
      peVar1 = (this->super_UnaryExpr).expr.super_shared_ptr<pegmatite::Expr>.
               super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar2 = (*peVar1->_vptr_Expr[3])(peVar1,con);
    } while ((char)iVar2 != '\0');
  }
  pegmatite::Context::restore(con,st_00);
  return true;
}

Assistant:

virtual bool parse_term(Context &con) const
	{
		//if parsing of the first fails, restore the context and stop
		ParsingState st(con);
		if (!expr->parse_term(con))
		{
			con.restore(st);
			return true;
		}

		//parse the rest until no more parsing is possible
		for(;;)
		{
			ParsingState s(con);
			if (!expr->parse_term(con))
			{
				con.restore(s);
				break;
			}
		}

		return true;
	}